

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::RemoveEntry(cmCursesMainForm *this,char *value)

{
  cmake *this_00;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *this_01;
  iterator iVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  const_iterator local_78;
  allocator local_59;
  string local_58;
  char *local_38;
  char *val;
  cmCursesCacheEntryComposite **local_28;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_20;
  iterator it;
  char *value_local;
  cmCursesMainForm *this_local;
  
  if (value != (char *)0x0) {
    it._M_current = (cmCursesCacheEntryComposite **)value;
    __gnu_cxx::
    __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
    ::__normal_iterator(&local_20);
    local_28 = (cmCursesCacheEntryComposite **)
               std::
               vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               ::begin(this->Entries);
    local_20._M_current = local_28;
    while( true ) {
      val = (char *)std::
                    vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                    ::end(this->Entries);
      bVar2 = __gnu_cxx::operator!=
                        (&local_20,
                         (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                          *)&val);
      if (!bVar2) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                ::operator*(&local_20);
      local_38 = cmCursesCacheEntryComposite::GetValue(*ppcVar4);
      if ((local_38 != (char *)0x0) &&
         (iVar3 = strcmp((char *)it._M_current,local_38), iVar1 = it, iVar3 == 0)) {
        this_00 = this->CMakeInstance;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_58,(char *)iVar1._M_current,&local_59);
        cmake::UnwatchUnusedCli(this_00,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
        this_01 = this->Entries;
        __gnu_cxx::
        __normal_iterator<cmCursesCacheEntryComposite*const*,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>
        ::__normal_iterator<cmCursesCacheEntryComposite**>
                  ((__normal_iterator<cmCursesCacheEntryComposite*const*,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>
                    *)&local_78,&local_20);
        std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>::
        erase(this_01,local_78);
        return;
      }
      __gnu_cxx::
      __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void cmCursesMainForm::RemoveEntry(const char* value)
{
  if (!value)
    {
    return;
    }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* val = (*it)->GetValue();
    if (  val && !strcmp(value, val) )
      {
      this->CMakeInstance->UnwatchUnusedCli(value);
      this->Entries->erase(it);
      break;
      }
    }
}